

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
TwoValuesWithHashCollision_InternalCollision_Test::
~TwoValuesWithHashCollision_InternalCollision_Test
          (TwoValuesWithHashCollision_InternalCollision_Test *this)

{
  anon_unknown.dwarf_13be9a::TwoValuesWithHashCollision::~TwoValuesWithHashCollision
            (&this->super_TwoValuesWithHashCollision);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, InternalCollision) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});

    // After inserting "a" and "b", the index root is an internal node. when inserting "c", this
    // unit test checks the insert_or_assign_node function. With a known hash function and the
    // insertion order below, we should end up with a trie which looks like:
    //
    //              +--------+
    // root_ ->     | 000000 |                      (hash bits 0-5)
    //              +--------+
    //                   |
    //                   v
    //           +--------+--------+--------+
    // level1 -> | 000000 | 000001 | 000010 |       (hash bits 6-11)
    //           +--------+--------+--------+
    //                |       |        |
    //                v       |        |
    //               "a"      v        |            (0b000000'000000)
    //                       "b"       v            (0b000001'000000)
    //                                "c"           (0b000010'000000)
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    EXPECT_EQ (3U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "c")) << "key \"c\" should be present in the index";
    {
        // Check that the trie was laid out as we expected in the heap.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b1U);

        auto level1 = (*root_internal)[0];
        this->check_is_heap_internal_node (level1);

        auto level1_internal = level1.untag<internal_node *> ();
        EXPECT_EQ (level1_internal->get_bitmap (), 0b111U);
        this->check_is_leaf_node ((*level1_internal)[0]);
        this->check_is_leaf_node ((*level1_internal)[1]);
        this->check_is_leaf_node ((*level1_internal)[2]);
        index_->flush (t1, db_.get_current_revision ());
    }
    {
        // Check that the trie was laid out as we expected in the store.
        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);
        auto root_address = root.untag_address<internal_node> ();
        std::shared_ptr<internal_node const> const root_internal =
            internal_node::read_node (db_, root_address);
        EXPECT_EQ (root_internal->get_bitmap (), 0b1U);

        auto level1 = (*root_internal)[0];
        this->check_is_store_internal_node (level1);
        auto level1_address = level1.untag_address<internal_node> ();
        auto level1_internal = internal_node::read_node (db_, level1_address);
        EXPECT_EQ (level1_internal->get_bitmap (), 0b111U);
        this->check_is_leaf_node ((*level1_internal)[0]);
        this->check_is_leaf_node ((*level1_internal)[1]);
        EXPECT_TRUE (this->is_found (*index_, "a")) << "key \"a\" should be present in the index";
        EXPECT_TRUE (this->is_found (*index_, "b")) << "key \"b\" should be present in the index";
        EXPECT_TRUE (this->is_found (*index_, "c")) << "key \"c\" should be present in the index";
    }
}